

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
test_unary::grad_expect
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,test_unary *this)

{
  size_type sVar1;
  undefined4 uVar2;
  initializer_list<float> __l;
  allocator_type local_11;
  ulong local_10;
  
  switch(this->op) {
  case GGML_UNARY_OP_ABS:
    uVar2 = 0xbf800000;
    break;
  case GGML_UNARY_OP_SGN:
  case GGML_UNARY_OP_STEP:
    local_10 = local_10 & 0xffffffff00000000;
    sVar1 = 1;
    goto LAB_0012b579;
  default:
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  case GGML_UNARY_OP_RELU:
    uVar2 = 0;
  }
  local_10 = CONCAT44(0x3f800000,uVar2);
  sVar1 = 2;
LAB_0012b579:
  __l._M_array = (iterator)&local_10;
  __l._M_len = sVar1;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,__l,&local_11);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> grad_expect() override {
        if (op == GGML_UNARY_OP_ABS) {
            return {-1.0f, 1.0f};
        }
        if (op == GGML_UNARY_OP_SGN || op == GGML_UNARY_OP_STEP) {
            return {0.0f};
        }
        if (op == GGML_UNARY_OP_RELU) {
            return {0.0f, 1.0f};
        }
        return {};
    }